

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O3

key_type * __thiscall
nlohmann::json_abi_v3_11_3::detail::
iter_impl<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
::key(iter_impl<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
      *this)

{
  invalid_iterator *__return_storage_ptr__;
  string local_40;
  
  if (this->m_object == (pointer)0x0) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/common/json.hpp"
               ,0x3519,"GGML_ASSERT(%s) failed","m_object != nullptr");
  }
  if ((this->m_object->m_data).m_type == object) {
    return &((this->m_it).object_iterator._M_current)->first;
  }
  __return_storage_ptr__ = (invalid_iterator *)__cxa_allocate_exception(0x20);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_40,"cannot use key() for non-object iterators","");
  invalid_iterator::
  create<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_*,_0>
            (__return_storage_ptr__,0xcf,&local_40,this->m_object);
  __cxa_throw(__return_storage_ptr__,&invalid_iterator::typeinfo,exception::~exception);
}

Assistant:

const typename object_t::key_type& key() const
    {
        JSON_ASSERT(m_object != nullptr);

        if (JSON_HEDLEY_LIKELY(m_object->is_object()))
        {
            return m_it.object_iterator->first;
        }

        JSON_THROW(invalid_iterator::create(207, "cannot use key() for non-object iterators", m_object));
    }